

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O0

void __thiscall google::protobuf::io::anon_unknown_0::VarintCases::VarintCases(VarintCases *this)

{
  VarintCases *this_local;
  
  CodedStreamTest::CodedStreamTest(&this->super_CodedStreamTest);
  testing::WithParamInterface<google::protobuf::io::(anonymous_namespace)::VarintCase>::
  WithParamInterface(&this->
                      super_WithParamInterface<google::protobuf::io::(anonymous_namespace)::VarintCase>
                    );
  (this->super_CodedStreamTest).super_Test._vptr_Test = (_func_int **)&PTR__VarintCases_02a13ff8;
  (this->super_WithParamInterface<google::protobuf::io::(anonymous_namespace)::VarintCase>).
  _vptr_WithParamInterface = (_func_int **)&PTR__VarintCases_02a14038;
  return;
}

Assistant:

TEST_P(VarintCases, ExpectTag) {
  const VarintCase& kVarintCases_case = GetParam();
  // Leave one byte at the beginning of the buffer so we can read it
  // to force the first buffer to be loaded.
  buffer_[0] = '\0';
  memcpy(buffer_ + 1, kVarintCases_case.bytes, kVarintCases_case.size);
  ArrayInputStream input(buffer_, sizeof(buffer_));

  {
    CodedInputStream coded_input(&input);

    // Read one byte to force coded_input.Refill() to be called.  Otherwise,
    // ExpectTag() will return a false negative.
    uint8_t dummy;
    coded_input.ReadRaw(&dummy, 1);
    EXPECT_EQ((uint)'\0', (uint)dummy);

    uint32_t expected_value = static_cast<uint32_t>(kVarintCases_case.value);

    // ExpectTag() produces false negatives for large values.
    if (kVarintCases_case.size <= 2) {
      EXPECT_FALSE(coded_input.ExpectTag(expected_value + 1));
      EXPECT_TRUE(coded_input.ExpectTag(expected_value));
    } else {
      EXPECT_FALSE(coded_input.ExpectTag(expected_value));
    }
  }

  if (kVarintCases_case.size <= 2) {
    EXPECT_EQ(kVarintCases_case.size + 1, input.ByteCount());
  } else {
    EXPECT_EQ(1, input.ByteCount());
  }
}